

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powell.hpp
# Opt level: O0

vec3f optimize(vec3f initial,function<double_(vec3f)> *loss)

{
  double dVar1;
  vec3f vVar2;
  initializer_list<vec3f> __l;
  data_t dVar3;
  bool bVar4;
  reference pvVar5;
  size_type __n;
  reference pvVar6;
  vec3f vVar7;
  int local_234;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_230;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_228;
  undefined8 local_220;
  data_t local_218;
  vec3f local_210;
  vec3f local_200;
  undefined8 local_1f0;
  data_t local_1e8;
  double *local_1e0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1d8;
  double local_1d0;
  double improve;
  double local_1c0;
  data_t local_1b8;
  double local_1b0;
  data_t local_1a8;
  double local_1a0;
  double f1;
  data_t local_190;
  vec3f local_188;
  vec3f local_178;
  double local_168;
  vec3f x1;
  function<double_(double)> local_140;
  double local_120;
  double t;
  vec3f d;
  iterator __end2;
  iterator __begin2;
  vector<vec3f,_std::allocator<vec3f>_> *__range2;
  double local_d0;
  double f;
  vec3f x;
  vector<double,_std::allocator<double>_> improvement;
  double totalimprove;
  allocator<vec3f> local_85;
  vec3f local_84;
  vec3f local_78;
  vec3f local_6c;
  vec3f *local_60;
  size_type local_58;
  undefined1 local_50 [8];
  vector<vec3f,_std::allocator<vec3f>_> dir;
  function<double_(vec3f)> *loss_local;
  vec3f initial_local;
  vec3f x0;
  
  initial_local.x = initial.z;
  dir.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)loss;
  vec3f::vec3f(&local_84,1.0,0.0,0.0);
  vec3f::vec3f(&local_78,0.0,1.0,0.0);
  vec3f::vec3f(&local_6c,0.0,0.0,1.0);
  local_58 = 3;
  local_60 = &local_84;
  std::allocator<vec3f>::allocator(&local_85);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::vector<vec3f,_std::allocator<vec3f>_>::vector
            ((vector<vec3f,_std::allocator<vec3f>_> *)local_50,__l,&local_85);
  std::allocator<vec3f>::~allocator(&local_85);
  x0.x = initial_local.x;
  initial_local._4_8_ = initial._0_8_;
  do {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&x.z);
    x.x = x0.x;
    f = (double)initial_local._4_8_;
    vVar7.z = x0.x;
    vVar7.x = initial_local.y;
    vVar7.y = initial_local.z;
    local_d0 = std::function<double_(vec3f)>::operator()(loss,vVar7);
    __end2 = std::vector<vec3f,_std::allocator<vec3f>_>::begin
                       ((vector<vec3f,_std::allocator<vec3f>_> *)local_50);
    register0x00000000 =
         std::vector<vec3f,_std::allocator<vec3f>_>::end
                   ((vector<vec3f,_std::allocator<vec3f>_> *)local_50);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<vec3f_*,_std::vector<vec3f,_std::allocator<vec3f>_>_>
                                       *)&d.z), bVar4) {
      pvVar5 = __gnu_cxx::__normal_iterator<vec3f_*,_std::vector<vec3f,_std::allocator<vec3f>_>_>::
               operator*(&__end2);
      d.x = pvVar5->z;
      t = *(double *)pvVar5;
      unique0x10000774 = loss;
      std::function<double(double)>::
      function<optimize(vec3f,std::function<double(vec3f)>)::__0,void>
                ((function<double(double)> *)&local_140,(anon_class_24_3_f4390644 *)&x1.z);
      dVar1 = optimize(0.0,&local_140);
      std::function<double_(double)>::~function(&local_140);
      local_120 = dVar1;
      vVar7 = operator*((float)dVar1,(vec3f *)&t);
      local_188.z = vVar7.z;
      local_188._0_8_ = vVar7._0_8_;
      local_178._0_8_ = local_188._0_8_;
      local_178.z = local_188.z;
      vVar7 = operator+((vec3f *)&f,&local_178);
      local_1b8 = vVar7.z;
      local_1c0 = vVar7._0_8_;
      local_1b0 = local_1c0;
      local_1a8 = local_1b8;
      f1 = local_1c0;
      local_190 = local_1b8;
      local_168 = local_1c0;
      x1.x = local_1b8;
      local_1a0 = std::function<double_(vec3f)>::operator()(loss,vVar7);
      improve = local_d0 - local_1a0;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&x.z,&improve);
      f = local_168;
      x.x = x1.x;
      local_d0 = local_1a0;
      __gnu_cxx::__normal_iterator<vec3f_*,_std::vector<vec3f,_std::allocator<vec3f>_>_>::operator++
                (&__end2);
    }
    local_1d8._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)&x.z);
    local_1e0 = (double *)
                std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)&x.z);
    local_1d0 = std::
                accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                          (local_1d8,
                           (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            )local_1e0,0.0);
    vVar7 = operator-((vec3f *)&f,(vec3f *)&initial_local.y);
    local_210.z = vVar7.z;
    local_210._0_8_ = vVar7._0_8_;
    local_200._0_8_ = local_210._0_8_;
    local_200.z = local_210.z;
    vVar7 = normalized(&local_200);
    local_218 = vVar7.z;
    local_220 = vVar7._0_8_;
    local_1f0 = local_220;
    local_1e8 = local_218;
    local_228._M_current =
         (double *)
         argmax<std::vector<double,std::allocator<double>>>
                   ((vector<double,_std::allocator<double>_> *)&x.z);
    local_230._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)&x.z);
    __n = __gnu_cxx::operator-(&local_228,&local_230);
    pvVar6 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                       ((vector<vec3f,_std::allocator<vec3f>_> *)local_50,__n);
    dVar3 = x.x;
    pvVar6->x = (data_t)(undefined4)local_1f0;
    pvVar6->y = (data_t)local_1f0._4_4_;
    pvVar6->z = local_1e8;
    initial_local._4_8_ = f;
    x0.x = x.x;
    if (1e-05 <= local_1d0) {
      local_234 = 0;
    }
    else {
      local_234 = 3;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&x.z);
  } while (local_234 == 0);
  std::vector<vec3f,_std::allocator<vec3f>_>::~vector
            ((vector<vec3f,_std::allocator<vec3f>_> *)local_50);
  vVar2.z = dVar3;
  vVar2.x = initial_local.y;
  vVar2.y = initial_local.z;
  return vVar2;
}

Assistant:

vec3f optimize(vec3f initial, std::function<double(vec3f)> loss)
{
	// Powell's method
	std::vector<vec3f> dir = {{1,0,0},{0,1,0},{0,0,1}};
	vec3f x0 = initial;
	double totalimprove = 0;
	while (true) {
		std::vector<double> improvement;
		vec3f x = x0;
		double f = loss(x0);
		for (auto d: dir) {
			double t = optimize(0, [&](double t){return loss(x+t*d);});
			vec3f x1 = x+t*d;
			double f1 = loss(x1);
			improvement.push_back(f - f1);
			x = x1;
			f = f1;
		}
		double improve = std::accumulate(improvement.begin(), improvement.end(), 0.0);
		// console.log("  improve",improve);
		totalimprove += improve;
		dir[argmax(improvement) - improvement.begin()] = normalized(x-x0);
		x0 = x;
		if (improve < 1e-5) break;
	}
	// console.log("total improve:", totalimprove);
	return x0;
}